

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

float recall_tree_ns::train_node(recall_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  node *pnVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  fVar3 = (ec->l).simple.label;
  fVar1 = (ec->l).simple.weight;
  fVar4 = (ec->pred).scalar;
  dVar7 = updated_entropy(b,(b->nodes)._begin[cn].left,ec);
  dVar8 = updated_entropy(b,(b->nodes)._begin[cn].right,ec);
  pnVar5 = (b->nodes)._begin;
  dVar6 = (double)fVar1;
  dVar7 = pnVar5[pnVar5[cn].left].n * (dVar7 - pnVar5[pnVar5[cn].left].entropy) + dVar6 * dVar7;
  dVar8 = pnVar5[pnVar5[cn].right].n * (dVar8 - pnVar5[pnVar5[cn].right].entropy) + dVar6 * dVar8;
  (ec->l).simple.label = *(float *)(&DAT_0023bd30 + (ulong)(dVar7 < dVar8) * 4);
  (ec->l).simple.weight = ABS((float)(dVar7 - dVar8));
  (ec->l).simple.initial = 0.0;
  LEARNER::learner<char,_example>::learn(base,ec,(ulong)(b->nodes)._begin[cn].base_router);
  LEARNER::learner<char,_example>::predict(base,ec,(ulong)(b->nodes)._begin[cn].base_router);
  fVar2 = (ec->pred).scalar;
  (ec->l).simple.label = fVar3;
  (ec->l).simple.weight = fVar1;
  (ec->pred).scalar = fVar4;
  return fVar2;
}

Assistant:

float train_node(recall_tree& b, single_learner& base, example& ec, uint32_t cn)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  // minimize entropy
  // better than maximize expected likelihood, and the proofs go through :)
  double new_left = updated_entropy(b, b.nodes[cn].left, ec);
  double new_right = updated_entropy(b, b.nodes[cn].right, ec);
  double old_left = b.nodes[b.nodes[cn].left].entropy;
  double old_right = b.nodes[b.nodes[cn].right].entropy;
  double nl = b.nodes[b.nodes[cn].left].n;
  double nr = b.nodes[b.nodes[cn].right].n;
  double delta_left = nl * (new_left - old_left) + mc.weight * new_left;
  double delta_right = nr * (new_right - old_right) + mc.weight * new_right;
  float route_label = delta_left < delta_right ? -1.f : 1.f;
  float imp_weight = fabs((float)(delta_left - delta_right));

  ec.l.simple = {route_label, imp_weight, 0.};
  base.learn(ec, b.nodes[cn].base_router);

  // TODO: using the updated routing seems to help
  // TODO: consider faster version using updated_prediction
  // TODO: (doesn't play well with link function)
  base.predict(ec, b.nodes[cn].base_router);

  float save_scalar = ec.pred.scalar;

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return save_scalar;
}